

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O0

MPP_RET update_curbyte_avs2(BitReadCtx_t *bitctx)

{
  byte *pbVar1;
  BitReadCtx_t *bitctx_local;
  
  if (bitctx->bytes_left_ == 0) {
    bitctx_local._4_4_ = MPP_ERR_READ_BIT;
  }
  else {
    if ((*bitctx->data_ == '\x02') && ((bitctx->prev_two_bytes_ & 0xffffU) == 0)) {
      bitctx->curr_byte_ = 0;
      bitctx->num_remaining_bits_in_curr_byte_ = 6;
      bitctx->data_ = bitctx->data_ + 1;
    }
    else {
      pbVar1 = bitctx->data_;
      bitctx->data_ = pbVar1 + 1;
      bitctx->curr_byte_ = (long)(int)(uint)*pbVar1;
      bitctx->num_remaining_bits_in_curr_byte_ = 8;
    }
    bitctx->prev_two_bytes_ = bitctx->prev_two_bytes_ << 8 | bitctx->curr_byte_;
    bitctx->bytes_left_ = bitctx->bytes_left_ - 1;
    bitctx_local._4_4_ = MPP_OK;
  }
  return bitctx_local._4_4_;
}

Assistant:

static MPP_RET update_curbyte_avs2(BitReadCtx_t *bitctx)
{
    if (bitctx->bytes_left_ < 1)
        return MPP_ERR_READ_BIT;

    if (*bitctx->data_ == 0x02 && ((bitctx->prev_two_bytes_ & 0xffff) == 0)) {
        // Detected 0x000002, get 2 bits from next byte
        bitctx->curr_byte_ = 0;
        bitctx->num_remaining_bits_in_curr_byte_ = 6;
        ++bitctx->data_;
    } else {
        bitctx->curr_byte_ = *bitctx->data_++ & 0xff;
        bitctx->num_remaining_bits_in_curr_byte_ = 8;
    }
    // Load a new byte and advance pointers.
    bitctx->prev_two_bytes_ = (bitctx->prev_two_bytes_ << 8) | bitctx->curr_byte_;
    --bitctx->bytes_left_;

    return MPP_OK;
}